

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

U32 ZSTD_btGetAllMatches_extDict_3
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  BYTE *iStart;
  BYTE *__s1;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  U32 UVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  BYTE *mEnd;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  uint *puVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  U32 UVar23;
  BYTE *__s1_00;
  uint uVar24;
  ulong uVar25;
  ulong uStack_110;
  ulong local_100;
  uint *local_e8;
  uint *local_e0;
  uint local_d0;
  uint local_cc;
  uint local_5c;
  BYTE *local_58;
  U32 *local_50;
  U32 *local_48;
  ulong local_40;
  U32 *local_38;
  
  if (3 < (ms->cParams).minMatch) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x33f,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar4 = (ms->window).base;
  uVar11 = (ulong)ms->nextToUpdate;
  if (ip < pBVar4 + uVar11) {
    return 0;
  }
  UVar23 = 1;
  local_50 = nextToUpdate3;
  while( true ) {
    uVar24 = (uint)uVar11;
    uVar7 = (uint)((long)ip - (long)pBVar4);
    if (uVar7 <= uVar24) break;
    UVar6 = ZSTD_insertBt1(ms,pBVar4 + uVar11,iHighLimit,uVar7,3,1);
    uVar11 = (ulong)(UVar6 + uVar24);
    if (UVar6 + uVar24 <= uVar24) {
      __assert_fail("idx < (U32)(idx + forward)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x236,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if ((ulong)((long)ip - (long)pBVar4) >> 0x20 != 0) {
    __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x239,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((ulong)((long)iHighLimit - (long)pBVar4) >> 0x20 != 0) {
    __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x23a,
                  "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->nextToUpdate = uVar7;
  uVar7 = (ms->cParams).targetLength;
  uVar24 = 0xfff;
  if (uVar7 < 0xfff) {
    uVar24 = uVar7;
  }
  uVar7 = (ms->cParams).hashLog;
  if (0x20 < uVar7) {
    __assert_fail("hBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
  }
  local_40 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar7 & 0x1fU));
  pBVar4 = (ms->window).base;
  uVar20 = (int)ip - (int)pBVar4;
  uVar21 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  local_100 = 0;
  uVar7 = uVar20 - uVar21;
  if (uVar20 < uVar21) {
    uVar7 = 0;
  }
  uVar8 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar1 = (ms->window).lowLimit;
  uVar19 = uVar20 - uVar8;
  if (uVar20 - uVar1 <= uVar8) {
    uVar19 = uVar1;
  }
  if (ms->loadedDictEnd != 0) {
    uVar19 = uVar1;
  }
  uVar8 = uVar19 + (uVar19 == 0);
  uVar1 = (ms->cParams).searchLog;
  if (1 < ll0) {
    __assert_fail("ll0 <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x27a,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  local_48 = ms->hashTable;
  uVar2 = local_48[local_40];
  local_38 = ms->chainTable;
  pBVar5 = (ms->window).dictBase;
  uVar3 = (ms->window).dictLimit;
  uVar22 = (ulong)uVar3;
  mEnd = pBVar5 + uVar22;
  iStart = pBVar4 + uVar22;
  uVar11 = (ulong)((uVar21 & uVar20) * 2);
  local_e0 = local_38 + uVar11;
  local_e8 = local_38 + uVar11 + 1;
  local_d0 = uVar20 + 9;
  uVar11 = (ulong)(lengthToBeat - 1);
  local_58 = ip + 3;
  for (uVar25 = (ulong)ll0; ll0 + 3 != uVar25; uVar25 = uVar25 + 1) {
    if (uVar25 == 3) {
      uVar15 = *rep - 1;
    }
    else {
      uVar15 = rep[uVar25];
    }
    if (uVar20 < uVar3) {
      __assert_fail("curr >= dictLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x281,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    uVar17 = uVar20 - uVar15;
    if (uVar15 - 1 < uVar20 - uVar3) {
      uVar9 = 0;
      if ((uVar19 <= uVar17) &&
         (uVar9 = 0, ((*(uint *)(ip + -(ulong)uVar15) ^ *(uint *)ip) & 0xffffff) == 0)) {
        sVar12 = ZSTD_count(local_58,local_58 + -(ulong)uVar15,iHighLimit);
        iVar10 = (int)sVar12;
LAB_006173c8:
        uVar9 = iVar10 + 3;
      }
    }
    else {
      if (uVar20 < uVar19) {
        __assert_fail("curr >= windowLow",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x28d,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      uVar9 = 0;
      if (((uVar15 - 1 < uVar20 - uVar19) && (uVar17 - uVar3 < 0xfffffffd)) &&
         (((*(uint *)(pBVar5 + uVar17) ^ *(uint *)ip) & 0xffffff) == 0)) {
        sVar12 = ZSTD_count_2segments
                           (local_58,(BYTE *)((long)(pBVar5 + uVar17) + 3),iHighLimit,mEnd,iStart);
        iVar10 = (int)sVar12;
        goto LAB_006173c8;
      }
    }
    uVar16 = (ulong)uVar9;
    if (uVar11 < uVar16) {
      matches[local_100].off = UVar23;
      matches[local_100].len = uVar9;
      uVar15 = (int)local_100 + 1;
      local_100 = (ulong)uVar15;
      if (uVar24 < uVar9) {
        return uVar15;
      }
      uVar11 = uVar16;
      if (ip + uVar16 == iHighLimit) {
        return uVar15;
      }
    }
    UVar23 = UVar23 + 1;
  }
  if (((uVar11 < 3) && (UVar23 = ZSTD_insertAndFindFirstIndexHash3(ms,local_50,ip), uVar8 <= UVar23)
      ) && (uVar20 - UVar23 < 0x40000)) {
    if (UVar23 < uVar3) {
      uVar25 = ZSTD_count_2segments(ip,pBVar5 + UVar23,iHighLimit,mEnd,iStart);
    }
    else {
      uVar25 = ZSTD_count(ip,pBVar4 + UVar23,iHighLimit);
    }
    if (2 < uVar25) {
      if (uVar20 <= UVar23) {
        __assert_fail("curr > matchIndex3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x2ba,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if ((int)local_100 != 0) {
        __assert_fail("mnum==0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,699,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      matches->off = (uVar20 - UVar23) + 3;
      matches->len = (U32)uVar25;
      if (uVar24 < uVar25 || ip + uVar25 == iHighLimit) {
        UVar6 = uVar20 + 1;
        UVar23 = 1;
        goto LAB_0061771b;
      }
      uStack_110 = 1;
      local_100 = uStack_110;
      uVar11 = uVar25;
    }
  }
  local_48[local_40] = uVar20;
  uVar25 = 0;
  uVar16 = 0;
  local_cc = 1 << ((byte)uVar1 & 0x1f);
LAB_006174db:
  uVar18 = (ulong)uVar2;
  UVar23 = (U32)local_100;
  if ((local_cc == 0) || (uVar2 < uVar8)) goto LAB_006176eb;
  uVar13 = uVar25;
  if (uVar16 < uVar25) {
    uVar13 = uVar16;
  }
  if (uVar20 <= uVar2) {
    __assert_fail("curr > matchIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x2cd,
                  "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                 );
  }
  if (uVar13 + uVar18 < uVar22) {
    __s1 = pBVar5 + uVar18;
    iVar10 = bcmp(__s1,ip,uVar13);
    if (iVar10 != 0) {
      __assert_fail("memcmp(match, ip, matchLength) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x2d6,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    sVar12 = ZSTD_count_2segments(ip + uVar13,__s1 + uVar13,iHighLimit,mEnd,iStart);
    uVar13 = sVar12 + uVar13;
    __s1_00 = pBVar4 + uVar18;
    if (uVar13 + uVar18 < uVar22) {
      __s1_00 = __s1;
    }
  }
  else {
    __s1_00 = pBVar4 + uVar18;
    if ((uVar3 <= uVar2) && (iVar10 = bcmp(__s1_00,ip,uVar13), iVar10 != 0)) {
      __assert_fail("memcmp(match, ip, matchLength) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x2d2,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    sVar12 = ZSTD_count(ip + uVar13,__s1_00 + uVar13,iHighLimit);
    uVar13 = sVar12 + uVar13;
  }
  if (uVar11 < uVar13) {
    if (local_d0 < uVar2 || local_d0 - uVar2 == 0) {
      __assert_fail("matchEndIdx > matchIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                    ,0x2df,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (local_d0 - uVar2 < uVar13) {
      local_d0 = (U32)uVar13 + uVar2;
    }
    matches[local_100].off = (uVar20 + 3) - uVar2;
    matches[local_100].len = (U32)uVar13;
    UVar23 = UVar23 + 1;
    local_100 = (ulong)UVar23;
    if ((0x1000 < uVar13) || (uVar11 = uVar13, ip + uVar13 == iHighLimit)) goto LAB_006176eb;
  }
  puVar14 = local_38 + (uVar2 & uVar21) * 2;
  UVar23 = (U32)local_100;
  if (__s1_00[uVar13] < ip[uVar13]) {
    *local_e0 = uVar2;
    if (uVar2 <= uVar7) {
      local_e0 = &local_5c;
LAB_006176eb:
      *local_e8 = 0;
      *local_e0 = 0;
      if (0x40000000 < local_cc) {
        __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x2fd,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (local_d0 <= uVar20 + 8) {
        __assert_fail("matchEndIdx > curr+8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                      ,0x324,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      UVar6 = local_d0 - 8;
LAB_0061771b:
      ms->nextToUpdate = UVar6;
      return UVar23;
    }
    puVar14 = puVar14 + 1;
    uVar16 = uVar13;
    local_e0 = puVar14;
  }
  else {
    *local_e8 = uVar2;
    local_e8 = puVar14;
    uVar25 = uVar13;
    if (uVar2 <= uVar7) {
      local_e8 = &local_5c;
      goto LAB_006176eb;
    }
  }
  uVar2 = *puVar14;
  local_cc = local_cc - 1;
  goto LAB_006174db;
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}